

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O3

ssize_t __thiscall
libnbt::NBTTagString::read(NBTTagString *this,int __fd,void *__buf,size_t __nbytes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int16_t length_00;
  undefined4 in_register_00000034;
  int16_t length;
  short local_3a;
  string local_38;
  
  length_00 = (int16_t)__nbytes;
  local_3a = 0;
  readBytes((istream *)CONCAT44(in_register_00000034,__fd),(char *)&local_3a,'\x02');
  readString_abi_cxx11_
            (&local_38,(libnbt *)CONCAT44(in_register_00000034,__fd),
             (istream *)(ulong)(uint)(int)local_3a,length_00);
  std::__cxx11::string::operator=
            ((string *)
             &(this->
              super_NBTTagData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )._data,(string *)&local_38);
  paVar1 = &local_38.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    paVar1 = extraout_RAX;
  }
  return (ssize_t)paVar1;
}

Assistant:

void NBTTagString::read(std::istream &in) {
        int16_t length = 0;
        readBytes(in, (char *) &length, 2);
        _data = readString(in, length);
    }